

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
          (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this,size_t size)

{
  size_t __t;
  char *__first;
  value_type *p;
  size_t sVar1;
  char *__result;
  char *new_data;
  char *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t size_local;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_local;
  
  __t = internal::basic_buffer<char>::capacity((basic_buffer<char> *)this);
  old_data = (char *)(__t + (__t >> 1));
  if (old_data < size) {
    old_data = (char *)size;
  }
  __first = internal::basic_buffer<char>::data((basic_buffer<char> *)this);
  p = internal::allocate<std::allocator<char>>(&this->super_allocator<char>,(size_t)old_data);
  sVar1 = internal::basic_buffer<char>::size((basic_buffer<char> *)this);
  __result = internal::make_checked<char>(p,(size_t)old_data);
  std::uninitialized_copy<char*,char*>(__first,__first + sVar1,__result);
  internal::basic_buffer<char>::set((basic_buffer<char> *)this,p,(size_t)old_data);
  if (__first != this->store_) {
    __gnu_cxx::new_allocator<char>::deallocate((new_allocator<char> *)this,__first,__t);
  }
  return;
}

Assistant:

void basic_memory_buffer<T, SIZE, Allocator>::grow(std::size_t size) {
  std::size_t old_capacity = this->capacity();
  std::size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
      new_capacity = size;
  T *old_data = this->data();
  T *new_data = internal::allocate<Allocator>(*this, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          internal::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_)
    Allocator::deallocate(old_data, old_capacity);
}